

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O0

Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
yaml::ParserContext::readSequence_abi_cxx11_
          (Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ParserContext *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  YamlEvent *pYVar3;
  vector<yaml::Value,_std::allocator<yaml::Value>_> *__args;
  Mapping *__args_00;
  string local_1c0;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  undefined1 local_160 [8];
  Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result_1;
  undefined1 local_108 [8];
  Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  YamlEvent event;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined1 local_60 [8];
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result;
  Sequence seq;
  ParserContext *this_local;
  
  std::vector<yaml::Value,_std::allocator<yaml::Value>_>::vector
            ((vector<yaml::Value,_std::allocator<yaml::Value>_> *)&event_result.has_value_);
  do {
    getNextEvent_abi_cxx11_
              ((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_60,this);
    bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_60);
    if (!bVar1) {
      pbVar2 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_60);
      std::operator+(&local_b0,"Error while reading sequence: ",pbVar2);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Unexpected(&local_90,&local_b0);
      Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,&local_90);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~Unexpected(&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      event.value.field_2._12_4_ = 1;
      goto LAB_0019ae9e;
    }
    pYVar3 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_60);
    YamlEvent::YamlEvent((YamlEvent *)&result.has_value_,pYVar3);
    switch(result._32_4_) {
    case (BADTYPE)0x6:
      std::vector<yaml::Value,std::allocator<yaml::Value>>::emplace_back<std::__cxx11::string>
                ((vector<yaml::Value,std::allocator<yaml::Value>> *)&event_result.has_value_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&event);
      goto LAB_0019ae88;
    case (BADTYPE)0x7:
      readSequence_abi_cxx11_
                ((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_108,this);
      bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_108);
      if (bVar1) {
        __args = Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_108);
        std::vector<yaml::Value,std::allocator<yaml::Value>>::
        emplace_back<std::vector<yaml::Value,std::allocator<yaml::Value>>>
                  ((vector<yaml::Value,std::allocator<yaml::Value>> *)&event_result.has_value_,
                   __args);
      }
      else {
        pbVar2 = Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::error((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_108);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&result_1.has_value_,pbVar2);
        Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,(UnexpectedType *)&result_1.has_value_);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Unexpected((Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&result_1.has_value_);
      }
      event.value.field_2._13_3_ = 0;
      event.value.field_2._M_local_buf[0xc] = !bVar1;
      Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_108);
      goto joined_r0x0019adaa;
    case (BADTYPE)0x8:
      Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,
                 (vector<yaml::Value,_std::allocator<yaml::Value>_> *)&event_result.has_value_);
      event.value.field_2._12_4_ = 1;
      break;
    case (BADTYPE)0x9:
      readMapping_abi_cxx11_
                ((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_160,this);
      bVar1 = ::Expected::operator_cast_to_bool((Expected *)local_160);
      if (bVar1) {
        __args_00 = Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_160);
        std::vector<yaml::Value,_std::allocator<yaml::Value>_>::emplace_back<yaml::Mapping>
                  ((vector<yaml::Value,_std::allocator<yaml::Value>_> *)&event_result.has_value_,
                   __args_00);
      }
      else {
        pbVar2 = Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::error((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_160);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Unexpected(&local_180,pbVar2);
        Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,&local_180);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Unexpected(&local_180);
      }
      event.value.field_2._13_3_ = 0;
      event.value.field_2._M_local_buf[0xc] = !bVar1;
      Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_160);
joined_r0x0019adaa:
      if (event.value.field_2._12_4_ == 0) {
LAB_0019ae88:
        event.value.field_2._12_4_ = 0;
      }
      break;
    default:
      format_abi_cxx11_(&local_1c0,"Unexpected event %d",(ulong)(uint)result._32_4_);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Unexpected(&local_1a0,&local_1c0);
      Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,&local_1a0);
      Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~Unexpected(&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      event.value.field_2._12_4_ = 1;
    }
    YamlEvent::~YamlEvent((YamlEvent *)&result.has_value_);
LAB_0019ae9e:
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_60);
    if (event.value.field_2._12_4_ != 0) {
      std::vector<yaml::Value,_std::allocator<yaml::Value>_>::~vector
                ((vector<yaml::Value,_std::allocator<yaml::Value>_> *)&event_result.has_value_);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Expected<Sequence, std::string> readSequence() {
		Sequence seq;
		for (;;) {
			auto event_result = getNextEvent();
			if (!event_result)
				return Unexpected("Error while reading sequence: " + event_result.error());
			YamlEvent event = std::move(event_result).value();

			switch (event.type) {
				case YAML_SCALAR_EVENT:
					MSG("YAML_SCALAR_EVENT: value=%s", event.value.c_str());
					seq.emplace_back(std::move(event.value));
					break;
				case YAML_SEQUENCE_START_EVENT:
					MSG("YAML_SEQUENCE_START_EVENT");
					{
						auto result = readSequence();
						if (!result)
							return Unexpected(result.error());
						seq.emplace_back(std::move(result).value());
					}
					break;
				case YAML_MAPPING_START_EVENT:
					MSG("YAML_MAPPING_START_EVENT");
					{
						auto result = readMapping();
						if (!result)
							return Unexpected(result.error());
						seq.emplace_back(std::move(result).value());
					}
					break;
				case YAML_SEQUENCE_END_EVENT:
					MSG("YAML_SEQUENCE_END_EVENT");
					return seq;
				default:
					return Unexpected(format("Unexpected event %d", event.type));
			}
		}
	}